

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_endswith(char *str,char *check)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  if (str != (char *)0x0 || check != (char *)0x0) {
    if ((str == (char *)0x0) != (check == (char *)0x0)) {
      return 0;
    }
    sVar1 = strlen(check);
    sVar2 = strlen(str);
    if (sVar2 < sVar1) {
      return 0;
    }
    for (lVar3 = 0; -lVar3 != sVar1; lVar3 = lVar3 + -1) {
      if (str[lVar3 + sVar2] != check[lVar3 + sVar1]) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int
fctstr_endswith(char const *str, char const *check)
{
    size_t check_i;
    size_t str_i;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    check_i = strlen(check);
    str_i = strlen(str);
    if ( str_i < check_i )
    {
        return 0;   /* Can't do it string is too small. */
    }
    for ( ; check_i != 0; --check_i, --str_i)
    {
        if ( str[str_i] != check[check_i] )
        {
            return 0; /* Found a case where they are not equal. */
        }
    }
    /* Exhausted check against string, can only be true. */
    return 1;
}